

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator=(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  longdouble *plVar5;
  int64_t iVar6;
  undefined4 extraout_var_00;
  long *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble *end;
  longdouble *dst;
  longdouble *src;
  int64_t size;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  longdouble *local_28;
  longdouble *local_20;
  
  iVar2 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar3 = (**(code **)(*in_RSI + 0x60))();
  if (CONCAT44(extraout_var,iVar2) != lVar3) {
    if ((in_RDI->fElem != (longdouble *)0x0) && (in_RDI->fElem != (longdouble *)0x0)) {
      operator_delete(in_RDI->fElem,0x10);
    }
    uVar4 = (**(code **)(*in_RSI + 600))();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    plVar5 = (longdouble *)operator_new__(uVar4);
    in_RDI->fElem = plVar5;
    if (in_RDI->fElem == (longdouble *)0x0) {
      TPZMatrix<long_double>::Error(in_stack_000001b0,in_stack_000001a8);
    }
  }
  iVar6 = (**(code **)(*in_RSI + 0x60))();
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar6;
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = iVar6;
  local_20 = (longdouble *)in_RSI[4];
  local_28 = in_RDI->fElem;
  plVar5 = in_RDI->fElem;
  iVar2 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])();
  while (local_28 < plVar5 + CONCAT44(extraout_var_00,iVar2)) {
    *local_28 = *local_20;
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
  }
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = (char)in_RSI[3];
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar> &
TPZSFMatrix<TVar> ::operator=(const TPZSFMatrix<TVar>  &A )
{
	if ( this->Dim() != A.Dim() )
    {
		if ( fElem != NULL )
        {
			delete( fElem );
        }
        int64_t size = A.Size();
		fElem = new TVar[ size ] ;
		if ( fElem == NULL )
			TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator= <memory allocation error>." );
    }
	
	this->fRow = this->fCol =  A.Dim();
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ = *src++;
	
	this->fDecomposed = A.fDecomposed;
	
	return *this;
}